

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringlist.cpp
# Opt level: O0

bool QtPrivate::QStringList_contains(QStringList *that,QLatin1StringView str,CaseSensitivity cs)

{
  bool bVar1;
  long in_FS_OFFSET;
  undefined4 unaff_retaddr;
  long lVar2;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = stringList_contains<QLatin1String>
                    (that,(QLatin1String *)CONCAT44(cs,unaff_retaddr),
                     (CaseSensitivity)((ulong)lVar2 >> 0x20));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QtPrivate::QStringList_contains(const QStringList *that, QLatin1StringView str,
                                     Qt::CaseSensitivity cs)
{
    return stringList_contains(*that, str, cs);
}